

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-tcp-bind-error.c
# Opt level: O3

int run_test_tcp_bind_error_addrinuse_listen(void)

{
  int iVar1;
  int extraout_EAX;
  undefined8 uVar2;
  code *unaff_RBX;
  long *plVar3;
  int64_t eval_b_1;
  int64_t eval_b_3;
  sockaddr_in addr;
  uv_tcp_t server2;
  uv_tcp_t server1;
  long lStack_c78;
  undefined4 uStack_c70;
  undefined8 uStack_c6c;
  undefined4 uStack_c64;
  undefined1 auStack_c60 [216];
  code *pcStack_b88;
  long lStack_b78;
  long lStack_b70;
  long alStack_b68 [11];
  undefined1 auStack_b10 [16];
  long alStack_b00 [25];
  undefined1 auStack_a38 [16];
  long alStack_a28 [27];
  code *pcStack_950;
  long lStack_940;
  long lStack_938;
  undefined1 auStack_930 [216];
  code *pcStack_858;
  long lStack_848;
  long lStack_840;
  undefined1 auStack_838 [16];
  long alStack_828 [27];
  code *pcStack_750;
  long lStack_740;
  long lStack_738;
  undefined1 auStack_730 [16];
  long alStack_720 [27];
  code *pcStack_648;
  long lStack_638;
  long lStack_630;
  undefined8 auStack_628 [2];
  undefined1 auStack_618 [16];
  long alStack_608 [27];
  code *pcStack_530;
  long lStack_528;
  long lStack_520;
  char acStack_518 [72];
  undefined1 auStack_4d0 [216];
  code *pcStack_3f8;
  long lStack_3e8;
  long lStack_3e0;
  undefined1 auStack_3d8 [16];
  long alStack_3c8 [27];
  code *pcStack_2f0;
  long lStack_2e0;
  long lStack_2d8;
  undefined1 auStack_2d0 [16];
  long alStack_2c0 [27];
  code *pcStack_1e8;
  code *pcStack_1e0;
  long local_1d8;
  long local_1d0;
  undefined1 local_1c8 [16];
  long local_1b8 [27];
  long local_e0 [27];
  
  plVar3 = &local_1d8;
  pcStack_1e0 = (code *)0x1c6470;
  iVar1 = uv_ip4_addr("0.0.0.0",0x23a3,local_1c8);
  local_e0[0] = (long)iVar1;
  local_1b8[0] = 0;
  if (local_e0[0] == 0) {
    pcStack_1e0 = (code *)0x1c649b;
    uVar2 = uv_default_loop();
    pcStack_1e0 = (code *)0x1c64ab;
    iVar1 = uv_tcp_init(uVar2,local_e0);
    local_1b8[0] = (long)iVar1;
    local_1d8 = 0;
    if (local_1b8[0] != 0) goto LAB_001c667d;
    pcStack_1e0 = (code *)0x1c64dd;
    iVar1 = uv_tcp_bind(local_e0,local_1c8,0);
    local_1b8[0] = (long)iVar1;
    local_1d8 = 0;
    if (local_1b8[0] != 0) goto LAB_001c668a;
    pcStack_1e0 = (code *)0x1c6500;
    uVar2 = uv_default_loop();
    pcStack_1e0 = (code *)0x1c650d;
    iVar1 = uv_tcp_init(uVar2,local_1b8);
    local_1d8 = (long)iVar1;
    local_1d0 = 0;
    if (local_1d8 != 0) goto LAB_001c6697;
    pcStack_1e0 = (code *)0x1c653c;
    iVar1 = uv_tcp_bind(local_1b8,local_1c8,0);
    local_1d8 = (long)iVar1;
    local_1d0 = 0;
    if (local_1d8 != 0) goto LAB_001c66a4;
    pcStack_1e0 = (code *)0x1c656e;
    iVar1 = uv_listen(local_e0,0x80,0);
    local_1d8 = (long)iVar1;
    local_1d0 = 0;
    if (local_1d8 != 0) goto LAB_001c66b1;
    pcStack_1e0 = (code *)0x1c659d;
    iVar1 = uv_listen(local_1b8,0x80,0);
    local_1d8 = (long)iVar1;
    local_1d0 = -0x62;
    if (local_1d8 != -0x62) goto LAB_001c66be;
    unaff_RBX = close_cb;
    pcStack_1e0 = (code *)0x1c65d2;
    uv_close(local_e0,close_cb);
    pcStack_1e0 = (code *)0x1c65df;
    uv_close(local_1b8,close_cb);
    pcStack_1e0 = (code *)0x1c65e4;
    uVar2 = uv_default_loop();
    pcStack_1e0 = (code *)0x1c65ee;
    uv_run(uVar2,0);
    local_1d8 = 2;
    local_1d0 = (long)close_cb_called;
    if (local_1d0 != 2) goto LAB_001c66cb;
    pcStack_1e0 = (code *)0x1c6616;
    unaff_RBX = (code *)uv_default_loop();
    pcStack_1e0 = (code *)0x1c662a;
    uv_walk(unaff_RBX,close_walk_cb,0);
    pcStack_1e0 = (code *)0x1c6634;
    uv_run(unaff_RBX,0);
    local_1d8 = 0;
    pcStack_1e0 = (code *)0x1c6641;
    uVar2 = uv_default_loop();
    pcStack_1e0 = (code *)0x1c6649;
    iVar1 = uv_loop_close(uVar2);
    local_1d0 = (long)iVar1;
    if (local_1d8 == local_1d0) {
      pcStack_1e0 = (code *)0x1c6660;
      uv_library_shutdown();
      return 0;
    }
  }
  else {
    pcStack_1e0 = (code *)0x1c667d;
    run_test_tcp_bind_error_addrinuse_listen_cold_1();
LAB_001c667d:
    pcStack_1e0 = (code *)0x1c668a;
    run_test_tcp_bind_error_addrinuse_listen_cold_2();
LAB_001c668a:
    pcStack_1e0 = (code *)0x1c6697;
    run_test_tcp_bind_error_addrinuse_listen_cold_3();
LAB_001c6697:
    pcStack_1e0 = (code *)0x1c66a4;
    run_test_tcp_bind_error_addrinuse_listen_cold_4();
LAB_001c66a4:
    pcStack_1e0 = (code *)0x1c66b1;
    run_test_tcp_bind_error_addrinuse_listen_cold_5();
LAB_001c66b1:
    pcStack_1e0 = (code *)0x1c66be;
    run_test_tcp_bind_error_addrinuse_listen_cold_6();
LAB_001c66be:
    pcStack_1e0 = (code *)0x1c66cb;
    run_test_tcp_bind_error_addrinuse_listen_cold_7();
LAB_001c66cb:
    pcStack_1e0 = (code *)0x1c66d8;
    run_test_tcp_bind_error_addrinuse_listen_cold_8();
  }
  pcStack_1e0 = close_cb;
  run_test_tcp_bind_error_addrinuse_listen_cold_9();
  if (plVar3 != (long *)0x0) {
    close_cb_called = close_cb_called + 1;
    return extraout_EAX;
  }
  pcStack_1e8 = run_test_tcp_bind_error_addrnotavail_1;
  close_cb_cold_1();
  pcStack_2f0 = (code *)0x1c6715;
  pcStack_1e8 = unaff_RBX;
  iVar1 = uv_ip4_addr("127.255.255.255",0x23a3,auStack_2d0);
  alStack_2c0[0] = (long)iVar1;
  lStack_2e0 = 0;
  if (alStack_2c0[0] == 0) {
    pcStack_2f0 = (code *)0x1c673a;
    uVar2 = uv_default_loop();
    pcStack_2f0 = (code *)0x1c6747;
    iVar1 = uv_tcp_init(uVar2,alStack_2c0);
    lStack_2e0 = (long)iVar1;
    lStack_2d8 = 0;
    if (lStack_2e0 != 0) goto LAB_001c6831;
    pcStack_2f0 = (code *)0x1c6778;
    iVar1 = uv_tcp_bind(alStack_2c0,auStack_2d0,0);
    if ((iVar1 == -99) || (iVar1 == 0)) {
      pcStack_2f0 = (code *)0x1c6796;
      uv_close(alStack_2c0,close_cb);
      pcStack_2f0 = (code *)0x1c679b;
      uVar2 = uv_default_loop();
      pcStack_2f0 = (code *)0x1c67a5;
      uv_run(uVar2,0);
      lStack_2e0 = 1;
      lStack_2d8 = (long)close_cb_called;
      if (lStack_2d8 != 1) goto LAB_001c6840;
      pcStack_2f0 = (code *)0x1c67cb;
      unaff_RBX = (code *)uv_default_loop();
      pcStack_2f0 = (code *)0x1c67df;
      uv_walk(unaff_RBX,close_walk_cb,0);
      pcStack_2f0 = (code *)0x1c67e9;
      uv_run(unaff_RBX,0);
      lStack_2e0 = 0;
      pcStack_2f0 = (code *)0x1c67f7;
      uVar2 = uv_default_loop();
      pcStack_2f0 = (code *)0x1c67ff;
      iVar1 = uv_loop_close(uVar2);
      lStack_2d8 = (long)iVar1;
      if (lStack_2e0 == lStack_2d8) {
        pcStack_2f0 = (code *)0x1c6817;
        uv_library_shutdown();
        return 0;
      }
      goto LAB_001c684f;
    }
  }
  else {
    pcStack_2f0 = (code *)0x1c6831;
    run_test_tcp_bind_error_addrnotavail_1_cold_1();
LAB_001c6831:
    pcStack_2f0 = (code *)0x1c6840;
    run_test_tcp_bind_error_addrnotavail_1_cold_2();
LAB_001c6840:
    pcStack_2f0 = (code *)0x1c684f;
    run_test_tcp_bind_error_addrnotavail_1_cold_3();
LAB_001c684f:
    pcStack_2f0 = (code *)0x1c685e;
    run_test_tcp_bind_error_addrnotavail_1_cold_4();
  }
  pcStack_2f0 = run_test_tcp_bind_error_addrnotavail_2;
  run_test_tcp_bind_error_addrnotavail_1_cold_5();
  pcStack_3f8 = (code *)0x1c6881;
  pcStack_2f0 = unaff_RBX;
  iVar1 = uv_ip4_addr("4.4.4.4",0x23a3,auStack_3d8);
  alStack_3c8[0] = (long)iVar1;
  lStack_3e8 = 0;
  if (alStack_3c8[0] == 0) {
    pcStack_3f8 = (code *)0x1c68a6;
    uVar2 = uv_default_loop();
    pcStack_3f8 = (code *)0x1c68b3;
    iVar1 = uv_tcp_init(uVar2,alStack_3c8);
    lStack_3e8 = (long)iVar1;
    lStack_3e0 = 0;
    if (lStack_3e8 != 0) goto LAB_001c69b4;
    pcStack_3f8 = (code *)0x1c68e4;
    iVar1 = uv_tcp_bind(alStack_3c8,auStack_3d8,0);
    lStack_3e8 = (long)iVar1;
    lStack_3e0 = -99;
    if (lStack_3e8 != -99) goto LAB_001c69c3;
    pcStack_3f8 = (code *)0x1c6915;
    uv_close(alStack_3c8,close_cb);
    pcStack_3f8 = (code *)0x1c691a;
    uVar2 = uv_default_loop();
    pcStack_3f8 = (code *)0x1c6924;
    uv_run(uVar2,0);
    lStack_3e8 = 1;
    lStack_3e0 = (long)close_cb_called;
    if (lStack_3e0 != 1) goto LAB_001c69d2;
    pcStack_3f8 = (code *)0x1c694e;
    unaff_RBX = (code *)uv_default_loop();
    pcStack_3f8 = (code *)0x1c6962;
    uv_walk(unaff_RBX,close_walk_cb,0);
    pcStack_3f8 = (code *)0x1c696c;
    uv_run(unaff_RBX,0);
    lStack_3e8 = 0;
    pcStack_3f8 = (code *)0x1c697a;
    uVar2 = uv_default_loop();
    pcStack_3f8 = (code *)0x1c6982;
    iVar1 = uv_loop_close(uVar2);
    lStack_3e0 = (long)iVar1;
    if (lStack_3e8 == lStack_3e0) {
      pcStack_3f8 = (code *)0x1c699a;
      uv_library_shutdown();
      return 0;
    }
  }
  else {
    pcStack_3f8 = (code *)0x1c69b4;
    run_test_tcp_bind_error_addrnotavail_2_cold_1();
LAB_001c69b4:
    pcStack_3f8 = (code *)0x1c69c3;
    run_test_tcp_bind_error_addrnotavail_2_cold_2();
LAB_001c69c3:
    pcStack_3f8 = (code *)0x1c69d2;
    run_test_tcp_bind_error_addrnotavail_2_cold_3();
LAB_001c69d2:
    pcStack_3f8 = (code *)0x1c69e1;
    run_test_tcp_bind_error_addrnotavail_2_cold_4();
  }
  pcStack_3f8 = run_test_tcp_bind_error_fault;
  run_test_tcp_bind_error_addrnotavail_2_cold_5();
  builtin_strncpy(acStack_518 + 0x30,"h blah blah",0xc);
  builtin_strncpy(acStack_518 + 0x20,"ah blah blah bla",0x10);
  builtin_strncpy(acStack_518 + 0x10,"lah blah blah bl",0x10);
  builtin_strncpy(acStack_518,"blah blah blah b",0x10);
  pcStack_530 = (code *)0x1c6a2d;
  pcStack_3f8 = unaff_RBX;
  uVar2 = uv_default_loop();
  pcStack_530 = (code *)0x1c6a3a;
  iVar1 = uv_tcp_init(uVar2,auStack_4d0);
  lStack_520 = (long)iVar1;
  lStack_528 = 0;
  if (lStack_520 == 0) {
    pcStack_530 = (code *)0x1c6a69;
    iVar1 = uv_tcp_bind(auStack_4d0,acStack_518,0);
    lStack_520 = (long)iVar1;
    lStack_528 = -0x16;
    if (lStack_520 != -0x16) goto LAB_001c6b2d;
    pcStack_530 = (code *)0x1c6a98;
    uv_close(auStack_4d0,close_cb);
    pcStack_530 = (code *)0x1c6a9d;
    uVar2 = uv_default_loop();
    pcStack_530 = (code *)0x1c6aa7;
    uv_run(uVar2,0);
    lStack_520 = 1;
    lStack_528 = (long)close_cb_called;
    if (lStack_528 != 1) goto LAB_001c6b3a;
    pcStack_530 = (code *)0x1c6acb;
    unaff_RBX = (code *)uv_default_loop();
    pcStack_530 = (code *)0x1c6adf;
    uv_walk(unaff_RBX,close_walk_cb,0);
    pcStack_530 = (code *)0x1c6ae9;
    uv_run(unaff_RBX,0);
    lStack_520 = 0;
    pcStack_530 = (code *)0x1c6af7;
    uVar2 = uv_default_loop();
    pcStack_530 = (code *)0x1c6aff;
    iVar1 = uv_loop_close(uVar2);
    lStack_528 = (long)iVar1;
    if (lStack_520 == lStack_528) {
      pcStack_530 = (code *)0x1c6b15;
      uv_library_shutdown();
      return 0;
    }
  }
  else {
    pcStack_530 = (code *)0x1c6b2d;
    run_test_tcp_bind_error_fault_cold_1();
LAB_001c6b2d:
    pcStack_530 = (code *)0x1c6b3a;
    run_test_tcp_bind_error_fault_cold_2();
LAB_001c6b3a:
    pcStack_530 = (code *)0x1c6b47;
    run_test_tcp_bind_error_fault_cold_3();
  }
  pcStack_530 = run_test_tcp_bind_error_inval;
  run_test_tcp_bind_error_fault_cold_4();
  pcStack_648 = (code *)0x1c6b72;
  pcStack_530 = unaff_RBX;
  iVar1 = uv_ip4_addr("0.0.0.0",0x23a3,auStack_618);
  alStack_608[0] = (long)iVar1;
  auStack_628[0] = 0;
  if (alStack_608[0] == 0) {
    pcStack_648 = (code *)0x1c6ba8;
    iVar1 = uv_ip4_addr("0.0.0.0",0x23a4,auStack_628);
    alStack_608[0] = (long)iVar1;
    lStack_638 = 0;
    if (alStack_608[0] != 0) goto LAB_001c6d0c;
    pcStack_648 = (code *)0x1c6bcd;
    uVar2 = uv_default_loop();
    pcStack_648 = (code *)0x1c6bda;
    iVar1 = uv_tcp_init(uVar2,alStack_608);
    lStack_638 = (long)iVar1;
    lStack_630 = 0;
    if (lStack_638 != 0) goto LAB_001c6d1b;
    pcStack_648 = (code *)0x1c6c0b;
    iVar1 = uv_tcp_bind(alStack_608,auStack_618,0);
    lStack_638 = (long)iVar1;
    lStack_630 = 0;
    if (lStack_638 != 0) goto LAB_001c6d2a;
    pcStack_648 = (code *)0x1c6c3c;
    iVar1 = uv_tcp_bind(alStack_608,auStack_628,0);
    lStack_638 = (long)iVar1;
    lStack_630 = -0x16;
    if (lStack_638 != -0x16) goto LAB_001c6d39;
    pcStack_648 = (code *)0x1c6c6d;
    uv_close(alStack_608,close_cb);
    pcStack_648 = (code *)0x1c6c72;
    uVar2 = uv_default_loop();
    pcStack_648 = (code *)0x1c6c7c;
    uv_run(uVar2,0);
    lStack_638 = 1;
    lStack_630 = (long)close_cb_called;
    if (lStack_630 != 1) goto LAB_001c6d48;
    pcStack_648 = (code *)0x1c6ca6;
    unaff_RBX = (code *)uv_default_loop();
    pcStack_648 = (code *)0x1c6cba;
    uv_walk(unaff_RBX,close_walk_cb,0);
    pcStack_648 = (code *)0x1c6cc4;
    uv_run(unaff_RBX,0);
    lStack_638 = 0;
    pcStack_648 = (code *)0x1c6cd2;
    uVar2 = uv_default_loop();
    pcStack_648 = (code *)0x1c6cda;
    iVar1 = uv_loop_close(uVar2);
    lStack_630 = (long)iVar1;
    if (lStack_638 == lStack_630) {
      pcStack_648 = (code *)0x1c6cf2;
      uv_library_shutdown();
      return 0;
    }
  }
  else {
    pcStack_648 = (code *)0x1c6d0c;
    run_test_tcp_bind_error_inval_cold_1();
LAB_001c6d0c:
    pcStack_648 = (code *)0x1c6d1b;
    run_test_tcp_bind_error_inval_cold_2();
LAB_001c6d1b:
    pcStack_648 = (code *)0x1c6d2a;
    run_test_tcp_bind_error_inval_cold_3();
LAB_001c6d2a:
    pcStack_648 = (code *)0x1c6d39;
    run_test_tcp_bind_error_inval_cold_4();
LAB_001c6d39:
    pcStack_648 = (code *)0x1c6d48;
    run_test_tcp_bind_error_inval_cold_5();
LAB_001c6d48:
    pcStack_648 = (code *)0x1c6d57;
    run_test_tcp_bind_error_inval_cold_6();
  }
  pcStack_648 = run_test_tcp_bind_localhost_ok;
  run_test_tcp_bind_error_inval_cold_7();
  pcStack_750 = (code *)0x1c6d84;
  pcStack_648 = unaff_RBX;
  iVar1 = uv_ip4_addr("127.0.0.1",0x23a3,auStack_730);
  alStack_720[0] = (long)iVar1;
  lStack_740 = 0;
  if (alStack_720[0] == 0) {
    pcStack_750 = (code *)0x1c6da9;
    uVar2 = uv_default_loop();
    pcStack_750 = (code *)0x1c6db6;
    iVar1 = uv_tcp_init(uVar2,alStack_720);
    lStack_740 = (long)iVar1;
    lStack_738 = 0;
    if (lStack_740 != 0) goto LAB_001c6e6e;
    pcStack_750 = (code *)0x1c6de7;
    iVar1 = uv_tcp_bind(alStack_720,auStack_730,0);
    lStack_740 = (long)iVar1;
    lStack_738 = 0;
    if (lStack_740 != 0) goto LAB_001c6e7d;
    pcStack_750 = (code *)0x1c6e08;
    unaff_RBX = (code *)uv_default_loop();
    pcStack_750 = (code *)0x1c6e1c;
    uv_walk(unaff_RBX,close_walk_cb,0);
    pcStack_750 = (code *)0x1c6e26;
    uv_run(unaff_RBX,0);
    lStack_740 = 0;
    pcStack_750 = (code *)0x1c6e34;
    uVar2 = uv_default_loop();
    pcStack_750 = (code *)0x1c6e3c;
    iVar1 = uv_loop_close(uVar2);
    lStack_738 = (long)iVar1;
    if (lStack_740 == lStack_738) {
      pcStack_750 = (code *)0x1c6e54;
      uv_library_shutdown();
      return 0;
    }
  }
  else {
    pcStack_750 = (code *)0x1c6e6e;
    run_test_tcp_bind_localhost_ok_cold_1();
LAB_001c6e6e:
    pcStack_750 = (code *)0x1c6e7d;
    run_test_tcp_bind_localhost_ok_cold_2();
LAB_001c6e7d:
    pcStack_750 = (code *)0x1c6e8c;
    run_test_tcp_bind_localhost_ok_cold_3();
  }
  pcStack_750 = run_test_tcp_bind_invalid_flags;
  run_test_tcp_bind_localhost_ok_cold_4();
  pcStack_858 = (code *)0x1c6eb9;
  pcStack_750 = unaff_RBX;
  iVar1 = uv_ip4_addr("127.0.0.1",0x23a3,auStack_838);
  alStack_828[0] = (long)iVar1;
  lStack_848 = 0;
  if (alStack_828[0] == 0) {
    pcStack_858 = (code *)0x1c6ede;
    uVar2 = uv_default_loop();
    pcStack_858 = (code *)0x1c6eeb;
    iVar1 = uv_tcp_init(uVar2,alStack_828);
    lStack_848 = (long)iVar1;
    lStack_840 = 0;
    if (lStack_848 != 0) goto LAB_001c6fa6;
    pcStack_858 = (code *)0x1c6f1f;
    iVar1 = uv_tcp_bind(alStack_828,auStack_838,1);
    lStack_848 = (long)iVar1;
    lStack_840 = -0x16;
    if (lStack_848 != -0x16) goto LAB_001c6fb5;
    pcStack_858 = (code *)0x1c6f40;
    unaff_RBX = (code *)uv_default_loop();
    pcStack_858 = (code *)0x1c6f54;
    uv_walk(unaff_RBX,close_walk_cb,0);
    pcStack_858 = (code *)0x1c6f5e;
    uv_run(unaff_RBX,0);
    lStack_848 = 0;
    pcStack_858 = (code *)0x1c6f6c;
    uVar2 = uv_default_loop();
    pcStack_858 = (code *)0x1c6f74;
    iVar1 = uv_loop_close(uVar2);
    lStack_840 = (long)iVar1;
    if (lStack_848 == lStack_840) {
      pcStack_858 = (code *)0x1c6f8c;
      uv_library_shutdown();
      return 0;
    }
  }
  else {
    pcStack_858 = (code *)0x1c6fa6;
    run_test_tcp_bind_invalid_flags_cold_1();
LAB_001c6fa6:
    pcStack_858 = (code *)0x1c6fb5;
    run_test_tcp_bind_invalid_flags_cold_2();
LAB_001c6fb5:
    pcStack_858 = (code *)0x1c6fc4;
    run_test_tcp_bind_invalid_flags_cold_3();
  }
  pcStack_858 = run_test_tcp_listen_without_bind;
  run_test_tcp_bind_invalid_flags_cold_4();
  pcStack_950 = (code *)0x1c6fe0;
  pcStack_858 = unaff_RBX;
  uVar2 = uv_default_loop();
  pcStack_950 = (code *)0x1c6fed;
  iVar1 = uv_tcp_init(uVar2,auStack_930);
  lStack_938 = (long)iVar1;
  lStack_940 = 0;
  if (lStack_938 == 0) {
    pcStack_950 = (code *)0x1c701e;
    iVar1 = uv_listen(auStack_930,0x80,0);
    lStack_938 = (long)iVar1;
    lStack_940 = 0;
    if (lStack_938 != 0) goto LAB_001c70a5;
    pcStack_950 = (code *)0x1c703f;
    unaff_RBX = (code *)uv_default_loop();
    pcStack_950 = (code *)0x1c7053;
    uv_walk(unaff_RBX,close_walk_cb,0);
    pcStack_950 = (code *)0x1c705d;
    uv_run(unaff_RBX,0);
    lStack_938 = 0;
    pcStack_950 = (code *)0x1c706b;
    uVar2 = uv_default_loop();
    pcStack_950 = (code *)0x1c7073;
    iVar1 = uv_loop_close(uVar2);
    lStack_940 = (long)iVar1;
    if (lStack_938 == lStack_940) {
      pcStack_950 = (code *)0x1c708b;
      uv_library_shutdown();
      return 0;
    }
  }
  else {
    pcStack_950 = (code *)0x1c70a5;
    run_test_tcp_listen_without_bind_cold_1();
LAB_001c70a5:
    pcStack_950 = (code *)0x1c70b4;
    run_test_tcp_listen_without_bind_cold_2();
  }
  pcStack_950 = run_test_tcp_bind_writable_flags;
  run_test_tcp_listen_without_bind_cold_3();
  pcStack_b88 = (code *)0x1c70e1;
  pcStack_950 = unaff_RBX;
  iVar1 = uv_ip4_addr("0.0.0.0",0x23a3,auStack_b10);
  alStack_a28[0] = (long)iVar1;
  alStack_b00[0] = 0;
  if (alStack_a28[0] == 0) {
    pcStack_b88 = (code *)0x1c7112;
    uVar2 = uv_default_loop();
    pcStack_b88 = (code *)0x1c7122;
    iVar1 = uv_tcp_init(uVar2,alStack_a28);
    alStack_b00[0] = (long)iVar1;
    alStack_b68[0] = 0;
    if (alStack_b00[0] != 0) goto LAB_001c73aa;
    pcStack_b88 = (code *)0x1c715c;
    iVar1 = uv_tcp_bind(alStack_a28,auStack_b10,0);
    alStack_b00[0] = (long)iVar1;
    alStack_b68[0] = 0;
    if (alStack_b00[0] != 0) goto LAB_001c73bc;
    pcStack_b88 = (code *)0x1c7196;
    iVar1 = uv_listen(alStack_a28,0x80,0);
    alStack_b00[0] = (long)iVar1;
    alStack_b68[0] = 0;
    if (alStack_b00[0] != 0) goto LAB_001c73ce;
    pcStack_b88 = (code *)0x1c71c9;
    iVar1 = uv_is_writable(alStack_a28);
    alStack_b00[0] = (long)iVar1;
    alStack_b68[0] = 0;
    if (alStack_b00[0] != 0) goto LAB_001c73e0;
    pcStack_b88 = (code *)0x1c71fc;
    iVar1 = uv_is_readable(alStack_a28);
    alStack_b00[0] = (long)iVar1;
    alStack_b68[0] = 0;
    if (alStack_b00[0] != 0) goto LAB_001c73f2;
    pcStack_b88 = (code *)0x1c7233;
    auStack_a38 = uv_buf_init("PING",4);
    pcStack_b88 = (code *)0x1c7262;
    iVar1 = uv_write(alStack_b00,alStack_a28,auStack_a38,1,0);
    alStack_b68[0] = (long)iVar1;
    lStack_b78 = -0x20;
    if (alStack_b68[0] != -0x20) goto LAB_001c7404;
    pcStack_b88 = (code *)0x1c7296;
    iVar1 = uv_shutdown(alStack_b68,alStack_a28,0);
    lStack_b78 = (long)iVar1;
    lStack_b70 = -0x6b;
    if (lStack_b78 != -0x6b) goto LAB_001c7413;
    pcStack_b88 = (code *)0x1c72cd;
    iVar1 = uv_read_start(alStack_a28,abort);
    lStack_b78 = (long)iVar1;
    lStack_b70 = -0x6b;
    if (lStack_b78 != -0x6b) goto LAB_001c7422;
    pcStack_b88 = (code *)0x1c7301;
    uv_close(alStack_a28,close_cb);
    pcStack_b88 = (code *)0x1c7306;
    uVar2 = uv_default_loop();
    pcStack_b88 = (code *)0x1c7310;
    uv_run(uVar2,0);
    lStack_b78 = 1;
    lStack_b70 = (long)close_cb_called;
    if (lStack_b70 != 1) goto LAB_001c7431;
    pcStack_b88 = (code *)0x1c733a;
    unaff_RBX = (code *)uv_default_loop();
    pcStack_b88 = (code *)0x1c734e;
    uv_walk(unaff_RBX,close_walk_cb,0);
    pcStack_b88 = (code *)0x1c7358;
    uv_run(unaff_RBX,0);
    lStack_b78 = 0;
    pcStack_b88 = (code *)0x1c7366;
    uVar2 = uv_default_loop();
    pcStack_b88 = (code *)0x1c736e;
    iVar1 = uv_loop_close(uVar2);
    lStack_b70 = (long)iVar1;
    if (lStack_b78 == lStack_b70) {
      pcStack_b88 = (code *)0x1c738a;
      uv_library_shutdown();
      return 0;
    }
  }
  else {
    pcStack_b88 = (code *)0x1c73aa;
    run_test_tcp_bind_writable_flags_cold_1();
LAB_001c73aa:
    pcStack_b88 = (code *)0x1c73bc;
    run_test_tcp_bind_writable_flags_cold_2();
LAB_001c73bc:
    pcStack_b88 = (code *)0x1c73ce;
    run_test_tcp_bind_writable_flags_cold_3();
LAB_001c73ce:
    pcStack_b88 = (code *)0x1c73e0;
    run_test_tcp_bind_writable_flags_cold_4();
LAB_001c73e0:
    pcStack_b88 = (code *)0x1c73f2;
    run_test_tcp_bind_writable_flags_cold_5();
LAB_001c73f2:
    pcStack_b88 = (code *)0x1c7404;
    run_test_tcp_bind_writable_flags_cold_6();
LAB_001c7404:
    pcStack_b88 = (code *)0x1c7413;
    run_test_tcp_bind_writable_flags_cold_7();
LAB_001c7413:
    pcStack_b88 = (code *)0x1c7422;
    run_test_tcp_bind_writable_flags_cold_8();
LAB_001c7422:
    pcStack_b88 = (code *)0x1c7431;
    run_test_tcp_bind_writable_flags_cold_9();
LAB_001c7431:
    pcStack_b88 = (code *)0x1c7440;
    run_test_tcp_bind_writable_flags_cold_10();
  }
  pcStack_b88 = run_test_tcp_bind_or_listen_error_after_close;
  run_test_tcp_bind_writable_flags_cold_11();
  uStack_c6c = 0;
  uStack_c64 = 0;
  uStack_c70 = 0xf270002;
  pcStack_b88 = unaff_RBX;
  uVar2 = uv_default_loop();
  iVar1 = uv_tcp_init(uVar2,auStack_c60);
  lStack_c78 = (long)iVar1;
  if (lStack_c78 == 0) {
    uv_close(auStack_c60,0);
    iVar1 = uv_tcp_bind(auStack_c60,&uStack_c70,0);
    lStack_c78 = (long)iVar1;
    if (lStack_c78 != -0x16) goto LAB_001c75a5;
    iVar1 = uv_listen(auStack_c60,5,0);
    lStack_c78 = (long)iVar1;
    if (lStack_c78 != -0x16) goto LAB_001c75b4;
    uVar2 = uv_default_loop();
    iVar1 = uv_run(uVar2,0);
    lStack_c78 = (long)iVar1;
    if (lStack_c78 == 0) {
      uVar2 = uv_default_loop();
      uv_walk(uVar2,close_walk_cb,0);
      uv_run(uVar2,0);
      lStack_c78 = 0;
      uVar2 = uv_default_loop();
      iVar1 = uv_loop_close(uVar2);
      if (lStack_c78 == iVar1) {
        uv_library_shutdown();
        return 0;
      }
      goto LAB_001c75d2;
    }
  }
  else {
    run_test_tcp_bind_or_listen_error_after_close_cold_1();
LAB_001c75a5:
    run_test_tcp_bind_or_listen_error_after_close_cold_2();
LAB_001c75b4:
    run_test_tcp_bind_or_listen_error_after_close_cold_3();
  }
  run_test_tcp_bind_or_listen_error_after_close_cold_4();
LAB_001c75d2:
  plVar3 = &lStack_c78;
  run_test_tcp_bind_or_listen_error_after_close_cold_5();
  iVar1 = uv_is_closing();
  if (iVar1 != 0) {
    return iVar1;
  }
  iVar1 = uv_close(plVar3,0);
  return iVar1;
}

Assistant:

TEST_IMPL(tcp_bind_error_addrinuse_listen) {
  struct sockaddr_in addr;
  uv_tcp_t server1, server2;
  int r;

  ASSERT_OK(uv_ip4_addr("0.0.0.0", TEST_PORT, &addr));
  r = uv_tcp_init(uv_default_loop(), &server1);
  ASSERT_OK(r);
  r = uv_tcp_bind(&server1, (const struct sockaddr*) &addr, 0);
  ASSERT_OK(r);

  r = uv_tcp_init(uv_default_loop(), &server2);
  ASSERT_OK(r);
  r = uv_tcp_bind(&server2, (const struct sockaddr*) &addr, 0);
  ASSERT_OK(r);

  r = uv_listen((uv_stream_t*)&server1, 128, NULL);
  ASSERT_OK(r);
  r = uv_listen((uv_stream_t*)&server2, 128, NULL);
  ASSERT_EQ(r, UV_EADDRINUSE);

  uv_close((uv_handle_t*)&server1, close_cb);
  uv_close((uv_handle_t*)&server2, close_cb);

  uv_run(uv_default_loop(), UV_RUN_DEFAULT);

  ASSERT_EQ(2, close_cb_called);

  MAKE_VALGRIND_HAPPY(uv_default_loop());
  return 0;
}